

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  TrafficLightsState *state_00;
  TrafficLights *this;
  TrafficLights *lights;
  TrafficLightsState *state;
  char **argv_local;
  int argc_local;
  
  state_00 = (TrafficLightsState *)operator_new(0x10);
  GreenLight::GreenLight((GreenLight *)state_00);
  this = (TrafficLights *)operator_new(0x10);
  TrafficLights::TrafficLights(this,state_00);
  TrafficLights::run(this);
  if (this != (TrafficLights *)0x0) {
    (*this->_vptr_TrafficLights[1])();
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	TrafficLightsState* state = new GreenLight();
	TrafficLights* lights = new TrafficLights(state);

	lights->run();

	delete lights;

	return 0;
}